

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  undefined8 target_00;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  Result RVar5;
  TargetType TVar6;
  size_type sVar7;
  const_reference pvVar8;
  cmMakefile *pcVar9;
  cmGlobalGenerator *this_00;
  ostream *poVar10;
  ulong uVar11;
  string *psVar12;
  char *pcVar13;
  basic_string_view<char,_std::char_traits<char>_> __y;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar14;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  char *local_9a0;
  char *local_978;
  char *local_950;
  char *local_928;
  char *local_900;
  char *local_8d8;
  cmLocalGenerator *local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  undefined1 local_708 [8];
  string linkedTargetsContent;
  string local_6c8;
  allocator<char> local_6a1;
  char *local_6a0;
  char *propContent_4;
  char *local_690;
  char *propContent_3;
  char *local_680;
  char *propContent_2;
  char *local_670;
  char *propContent_1;
  char *local_660;
  char *propContent;
  cmValue local_650;
  cmValue p;
  undefined1 local_640 [7];
  bool haveProp;
  string result;
  string local_600;
  cmListFileBacktrace local_5e0;
  undefined1 local_5d0 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  allocator<char> local_529;
  string local_528;
  string local_508;
  byte local_4e5;
  PolicyStatus local_4e4;
  undefined1 auStack_4e0 [3];
  bool evaluatingLinkLibraries;
  PolicyStatus polSt;
  char *local_4d8;
  byte local_4c9;
  undefined1 local_4c8 [7];
  bool isInterfaceProperty;
  string interfacePropertyName;
  string local_4a0;
  string local_480;
  allocator<char> local_459;
  string local_458;
  string local_438;
  allocator<char> local_411;
  string local_410;
  string local_3f0;
  _Base_ptr local_3d0;
  undefined1 local_3c8;
  allocator<char> local_3b9;
  string local_3b8;
  string local_398;
  allocator<char> local_371;
  string local_370;
  string local_350;
  _Base_ptr local_330;
  undefined1 local_328;
  _Base_ptr local_320;
  undefined1 local_318;
  string local_310;
  string local_2f0;
  undefined1 local_2d0 [8];
  ostringstream e_1;
  cmLocalGenerator *lg;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_128;
  cmGeneratorTarget *local_118;
  cmGeneratorTarget *tgt;
  char *local_108;
  cmGeneratorTarget *local_100;
  char *local_f8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_f0;
  undefined4 local_e0;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  char *local_98;
  char *e;
  string propertyName;
  string targetName;
  cmGeneratorTarget *target;
  cmGeneratorExpressionDAGChecker *dagCheckerParent_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetPropertyNode *this_local;
  
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar4 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  targetName.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(propertyName.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&e);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(parameters);
  if (sVar7 == 2) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](parameters,0);
    std::__cxx11::string::operator=
              ((string *)(propertyName.field_2._M_local_buf + 8),(string *)pvVar8);
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](parameters,1);
    std::__cxx11::string::operator=((string *)&e,(string *)pvVar8);
    local_98 = GetErrorText((string *)((long)&propertyName.field_2 + 8),(string *)&e);
    if (local_98 != (char *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b8,content);
      pcVar13 = local_98;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,pcVar13,&local_d9);
      reportError(context,&local_b8,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
      goto LAB_00ad6196;
    }
    local_f0 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&e);
    __y = (basic_string_view<char,_std::char_traits<char>_>)
          ::cm::operator____s("ALIASED_TARGET",0xe);
    local_108 = __y._M_str;
    tgt = (cmGeneratorTarget *)__y._M_len;
    local_100 = tgt;
    local_f8 = local_108;
    bVar1 = std::operator==(local_f0,__y);
    if (bVar1) {
      pcVar9 = cmLocalGenerator::GetMakefile(context->LG);
      bVar1 = cmMakefile::IsAlias(pcVar9,(string *)((long)&propertyName.field_2 + 8));
      if (bVar1) {
        local_118 = cmLocalGenerator::FindGeneratorTargetToUse
                              (context->LG,(string *)((long)&propertyName.field_2 + 8));
        if (local_118 != (cmGeneratorTarget *)0x0) {
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(local_118);
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar12);
          local_e0 = 1;
          goto LAB_00ad6196;
        }
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
      goto LAB_00ad6196;
    }
    local_128 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&e);
    local_148 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("ALIAS_GLOBAL",0xc);
    local_138 = local_148;
    bVar1 = std::operator==(local_128,local_148);
    if (bVar1) {
      pcVar9 = cmLocalGenerator::GetMakefile(context->LG);
      bVar1 = cmMakefile::IsAlias(pcVar9,(string *)((long)&propertyName.field_2 + 8));
      if (bVar1) {
        this_00 = cmLocalGenerator::GetGlobalGenerator(context->LG);
        bVar1 = cmGlobalGenerator::IsAlias(this_00,(string *)((long)&propertyName.field_2 + 8));
        pcVar13 = "FALSE";
        if (bVar1) {
          pcVar13 = "TRUE";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,pcVar13,(allocator<char> *)((long)&lg + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&lg + 7));
        local_e0 = 1;
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_e0 = 1;
      }
      goto LAB_00ad6196;
    }
    if (context->CurrentTarget == (cmGeneratorTarget *)0x0) {
      local_7b8 = context->LG;
    }
    else {
      local_7b8 = cmGeneratorTarget::GetLocalGenerator(context->CurrentTarget);
    }
    targetName.field_2._8_8_ =
         cmLocalGenerator::FindGeneratorTargetToUse
                   (local_7b8,(string *)((long)&propertyName.field_2 + 8));
    if ((cmGeneratorTarget *)targetName.field_2._8_8_ == (cmGeneratorTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
      poVar10 = std::operator<<((ostream *)local_2d0,"Target \"");
      poVar10 = std::operator<<(poVar10,(string *)(propertyName.field_2._M_local_buf + 8));
      std::operator<<(poVar10,"\" not found.");
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_2f0,content);
      std::__cxx11::ostringstream::str();
      reportError(context,&local_2f0,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
      goto LAB_00ad6196;
    }
    pVar14 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::insert(&context->AllTargets,(value_type *)((long)&targetName.field_2 + 8));
    local_320 = (_Base_ptr)pVar14.first._M_node;
    local_318 = pVar14.second;
  }
  else {
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(parameters);
    if (sVar7 != 1) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_398,content);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,
                 "$<TARGET_PROPERTY:...> expression requires one or two parameters",&local_3b9);
      reportError(context,&local_398,&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      std::__cxx11::string::~string((string *)&local_398);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
      goto LAB_00ad6196;
    }
    targetName.field_2._8_8_ = context->HeadTarget;
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](parameters,0);
    std::__cxx11::string::operator=((string *)&e,(string *)pvVar8);
    pVar15 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert(&context->SeenTargetProperties,(value_type *)&e);
    local_330 = (_Base_ptr)pVar15.first._M_node;
    local_328 = pVar15.second;
    context->HadHeadSensitiveCondition = true;
    if (targetName.field_2._8_8_ == 0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_350,content);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_370,
                 "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.   Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
                 ,&local_371);
      reportError(context,&local_350,&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::allocator<char>::~allocator(&local_371);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
      goto LAB_00ad6196;
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                          "SOURCES");
  if (bVar1) {
    pVar14 = std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::insert(&context->SourceSensitiveTargets,(value_type *)((long)&targetName.field_2 + 8)
                     );
    local_3d0 = (_Base_ptr)pVar14.first._M_node;
    local_3c8 = pVar14.second;
  }
  uVar11 = std::__cxx11::string::empty();
  if ((uVar11 & 1) != 0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_3f0,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,
               "$<TARGET_PROPERTY:...> expression requires a non-empty property name.",&local_411);
    reportError(context,&local_3f0,&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_e0 = 1;
    goto LAB_00ad6196;
  }
  bVar1 = cmsys::RegularExpression::find(&Evaluate::propertyNameValidator,(string *)&e);
  if (!bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_438,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_458,"Property name not supported.",&local_459);
    reportError(context,&local_438,&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator(&local_459);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_e0 = 1;
    goto LAB_00ad6196;
  }
  if (targetName.field_2._8_8_ == 0) {
    __assert_fail("target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                  ,0xb2b,
                  "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                 );
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                          "LINKER_LANGUAGE");
  if (bVar1) {
    bVar1 = cmGeneratorTarget::LinkLanguagePropagatesToDependents
                      ((cmGeneratorTarget *)targetName.field_2._8_8_);
    if ((bVar1) && (dagCheckerParent != (cmGeneratorExpressionDAGChecker *)0x0)) {
      bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY);
      if (!bVar1) {
        bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent);
        if (!bVar1) goto LAB_00ad4c0b;
      }
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_480,content);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a0,
                 "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                 ,(allocator<char> *)(interfacePropertyName.field_2._M_local_buf + 0xf));
      reportError(context,&local_480,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(interfacePropertyName.field_2._M_local_buf + 0xf));
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_e0 = 1;
    }
    else {
LAB_00ad4c0b:
      cmGeneratorTarget::GetLinkerLanguage
                (__return_storage_ptr__,(cmGeneratorTarget *)targetName.field_2._8_8_,
                 &context->Config);
      local_e0 = 1;
    }
    goto LAB_00ad6196;
  }
  std::__cxx11::string::string((string *)local_4c8);
  local_4c9 = 0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                          "INCLUDE_DIRECTORIES");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_4c8,"INTERFACE_INCLUDE_DIRECTORIES");
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                            "INTERFACE_INCLUDE_DIRECTORIES");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_4c8,"INTERFACE_INCLUDE_DIRECTORIES");
      local_4c9 = 1;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &e,"SYSTEM_INCLUDE_DIRECTORIES");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_4c8,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&e,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
        if (bVar1) {
          std::__cxx11::string::operator=
                    ((string *)local_4c8,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES");
          local_4c9 = 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&e,"COMPILE_DEFINITIONS");
          if (bVar1) {
            std::__cxx11::string::operator=((string *)local_4c8,"INTERFACE_COMPILE_DEFINITIONS");
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&e,"INTERFACE_COMPILE_DEFINITIONS");
            if (bVar1) {
              std::__cxx11::string::operator=((string *)local_4c8,"INTERFACE_COMPILE_DEFINITIONS");
              local_4c9 = 1;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&e,"COMPILE_OPTIONS");
              if (bVar1) {
                std::__cxx11::string::operator=((string *)local_4c8,"INTERFACE_COMPILE_OPTIONS");
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&e,"INTERFACE_COMPILE_OPTIONS");
                if (bVar1) {
                  std::__cxx11::string::operator=((string *)local_4c8,"INTERFACE_COMPILE_OPTIONS");
                  local_4c9 = 1;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&e,"AUTOMOC_MACRO_NAMES");
                  if (bVar1) {
                    std::__cxx11::string::operator=
                              ((string *)local_4c8,"INTERFACE_AUTOMOC_MACRO_NAMES");
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&e,"INTERFACE_AUTOMOC_MACRO_NAMES");
                    if (bVar1) {
                      std::__cxx11::string::operator=
                                ((string *)local_4c8,"INTERFACE_AUTOMOC_MACRO_NAMES");
                      local_4c9 = 1;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&e,"AUTOUIC_OPTIONS");
                      if (bVar1) {
                        std::__cxx11::string::operator=
                                  ((string *)local_4c8,"INTERFACE_AUTOUIC_OPTIONS");
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&e,"INTERFACE_AUTOUIC_OPTIONS");
                        if (bVar1) {
                          std::__cxx11::string::operator=
                                    ((string *)local_4c8,"INTERFACE_AUTOUIC_OPTIONS");
                          local_4c9 = 1;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"SOURCES");
                          if (bVar1) {
                            std::__cxx11::string::operator=((string *)local_4c8,"INTERFACE_SOURCES")
                            ;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_SOURCES");
                            if (bVar1) {
                              std::__cxx11::string::operator=
                                        ((string *)local_4c8,"INTERFACE_SOURCES");
                              local_4c9 = 1;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"COMPILE_FEATURES");
                              if (bVar1) {
                                std::__cxx11::string::operator=
                                          ((string *)local_4c8,"INTERFACE_COMPILE_FEATURES");
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_COMPILE_FEATURES");
                                if (bVar1) {
                                  std::__cxx11::string::operator=
                                            ((string *)local_4c8,"INTERFACE_COMPILE_FEATURES");
                                  local_4c9 = 1;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"LINK_OPTIONS");
                                  if (bVar1) {
                                    std::__cxx11::string::operator=
                                              ((string *)local_4c8,"INTERFACE_LINK_OPTIONS");
                                  }
                                  else {
                                    bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_LINK_OPTIONS");
                                    if (bVar1) {
                                      std::__cxx11::string::operator=
                                                ((string *)local_4c8,"INTERFACE_LINK_OPTIONS");
                                      local_4c9 = 1;
                                    }
                                    else {
                                      bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"LINK_DIRECTORIES");
                                      if (bVar1) {
                                        std::__cxx11::string::operator=
                                                  ((string *)local_4c8,"INTERFACE_LINK_DIRECTORIES")
                                        ;
                                      }
                                      else {
                                        bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_LINK_DIRECTORIES");
                                        if (bVar1) {
                                          std::__cxx11::string::operator=
                                                    ((string *)local_4c8,
                                                     "INTERFACE_LINK_DIRECTORIES");
                                          local_4c9 = 1;
                                        }
                                        else {
                                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"LINK_DEPENDS");
                                          if (bVar1) {
                                            std::__cxx11::string::operator=
                                                      ((string *)local_4c8,"INTERFACE_LINK_DEPENDS")
                                            ;
                                          }
                                          else {
                                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_LINK_DEPENDS");
                                            if (bVar1) {
                                              std::__cxx11::string::operator=
                                                        ((string *)local_4c8,
                                                         "INTERFACE_LINK_DEPENDS");
                                              local_4c9 = 1;
                                            }
                                            else {
                                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"PRECOMPILE_HEADERS");
                                              if (bVar1) {
                                                std::__cxx11::string::operator=
                                                          ((string *)local_4c8,
                                                           "INTERFACE_PRECOMPILE_HEADERS");
                                              }
                                              else {
                                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&e,"INTERFACE_PRECOMPILE_HEADERS");
                                                if (bVar1) {
                                                  std::__cxx11::string::operator=
                                                            ((string *)local_4c8,
                                                             "INTERFACE_PRECOMPILE_HEADERS");
                                                  local_4c9 = 1;
                                                }
                                                else {
                                                  _auStack_4e0 = (string_view)
                                                                 std::__cxx11::string::
                                                                 operator_cast_to_basic_string_view
                                                                           ((string *)&e);
                                                  bVar1 = cmHasLiteralPrefix<21ul>
                                                                    (_auStack_4e0,
                                                                     (char (*) [21])
                                                                     "COMPILE_DEFINITIONS_");
                                                  if (bVar1) {
                                                    local_4e4 = cmLocalGenerator::GetPolicyStatus
                                                                          (context->LG,CMP0043);
                                                    if ((local_4e4 == WARN) || (local_4e4 == OLD)) {
                                                      std::__cxx11::string::operator=
                                                                ((string *)local_4c8,
                                                                 "INTERFACE_COMPILE_DEFINITIONS");
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_4e5 = 0;
  if (dagCheckerParent != (cmGeneratorExpressionDAGChecker *)0x0) {
    bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(dagCheckerParent);
    if (bVar1) goto LAB_00ad5604;
    bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(dagCheckerParent);
    if (bVar1) goto LAB_00ad5604;
    bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkerLauncher(dagCheckerParent);
    if (bVar1) goto LAB_00ad5604;
    bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                      (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY);
    if (!bVar1) {
      bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories(dagCheckerParent);
      bVar1 = true;
      if (!bVar2) {
        bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                          (dagCheckerParent);
        bVar1 = true;
        if (!bVar2) {
          bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions(dagCheckerParent);
          bVar1 = true;
          if (!bVar2) {
            bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions(dagCheckerParent);
            bVar1 = true;
            if (!bVar2) {
              bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingAutoMocMacroNames(dagCheckerParent)
              ;
              bVar1 = true;
              if (!bVar2) {
                bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions(dagCheckerParent);
                bVar1 = true;
                if (!bVar2) {
                  bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagCheckerParent);
                  bVar1 = true;
                  if (!bVar2) {
                    bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                      (dagCheckerParent);
                    bVar1 = true;
                    if (!bVar2) {
                      bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions
                                        (dagCheckerParent);
                      bVar1 = true;
                      if (!bVar2) {
                        bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDirectories
                                          (dagCheckerParent);
                        bVar1 = true;
                        if (!bVar2) {
                          bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends
                                            (dagCheckerParent);
                          bVar1 = true;
                          if (!bVar2) {
                            bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingPrecompileHeaders
                                              (dagCheckerParent);
                            bVar1 = true;
                            if (!bVar2) {
                              bVar1 = false;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (!bVar1) {
        __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGeneratorExpressionNode.cxx"
                      ,0xb64,
                      "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                     );
      }
      goto LAB_00ad5604;
    }
    local_4e5 = 1;
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) != 0) goto LAB_00ad5604;
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_508,content);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_528,
               "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
               ,&local_529);
    reportError(context,&local_508,&local_528);
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator(&local_529);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_e0 = 1;
    goto LAB_00ad617a;
  }
LAB_00ad5604:
  if ((local_4c9 & 1) != 0) {
    cmGeneratorTarget::EvaluateInterfaceProperty
              ((string *)&dagChecker.CheckResult,(cmGeneratorTarget *)targetName.field_2._8_8_,
               (string *)&e,context,dagCheckerParent,Usage);
    cmGeneratorExpression::StripEmptyListElements
              (__return_storage_ptr__,(string *)&dagChecker.CheckResult);
    std::__cxx11::string::~string((string *)&dagChecker.CheckResult);
    local_e0 = 1;
    goto LAB_00ad617a;
  }
  cmListFileBacktrace::cmListFileBacktrace(&local_5e0,&context->Backtrace);
  target_00 = targetName.field_2._8_8_;
  std::__cxx11::string::string((string *)&local_600,(string *)&e);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_5d0,&local_5e0,(cmGeneratorTarget *)target_00,
             &local_600,content,dagCheckerParent);
  std::__cxx11::string::~string((string *)&local_600);
  cmListFileBacktrace::~cmListFileBacktrace(&local_5e0);
  RVar5 = cmGeneratorExpressionDAGChecker::Check((cmGeneratorExpressionDAGChecker *)local_5d0);
  switch(RVar5) {
  case DAG:
  case ALREADY_SEEN:
  default:
    std::__cxx11::string::string((string *)local_640);
    p.Value._7_1_ = 0;
    local_650 = cmGeneratorTarget::GetProperty
                          ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e);
    bVar1 = cmValue::operator_cast_to_bool(&local_650);
    if (!bVar1) {
      if ((local_4e5 & 1) == 0) goto LAB_00ad58bf;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      goto LAB_00ad6142;
    }
    psVar12 = cmValue::operator*[abi_cxx11_(&local_650);
    std::__cxx11::string::operator=((string *)local_640,(string *)psVar12);
    p.Value._7_1_ = 1;
LAB_00ad58bf:
    if ((p.Value._7_1_ & 1) == 0) {
      bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)targetName.field_2._8_8_);
      if (!bVar1) {
        TVar6 = cmGeneratorTarget::GetType((cmGeneratorTarget *)targetName.field_2._8_8_);
        if (TVar6 != INTERFACE_LIBRARY) {
          bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                            ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                             &context->Config);
          if (bVar1) {
            context->HadContextSensitiveCondition = true;
            bVar1 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
            if (bVar1) {
              local_8d8 = "1";
            }
            else {
              local_8d8 = "0";
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,local_8d8,
                       (allocator<char> *)((long)&propContent + 7));
            std::allocator<char>::~allocator((allocator<char> *)((long)&propContent + 7));
          }
          else {
            bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
            if (bVar1) {
              context->HadContextSensitiveCondition = true;
              local_660 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                    ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                     &context->Config);
              local_900 = local_660;
              if (local_660 == (char *)0x0) {
                local_900 = "";
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__return_storage_ptr__,local_900,
                         (allocator<char> *)((long)&propContent_1 + 7));
              std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_1 + 7));
            }
            else {
              bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                 &context->Config);
              if (bVar1) {
                context->HadContextSensitiveCondition = true;
                local_670 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                      ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                       &context->Config);
                local_928 = local_670;
                if (local_670 == (char *)0x0) {
                  local_928 = "";
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,local_928,
                           (allocator<char> *)((long)&propContent_2 + 7));
                std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_2 + 7));
              }
              else {
                bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                  ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                   &context->Config);
                if (!bVar1) goto LAB_00ad5d3a;
                context->HadContextSensitiveCondition = true;
                local_680 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                      ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                                       &context->Config);
                local_950 = local_680;
                if (local_680 == (char *)0x0) {
                  local_950 = "";
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)__return_storage_ptr__,local_950,
                           (allocator<char> *)((long)&propContent_3 + 7));
                std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_3 + 7));
              }
            }
          }
          goto LAB_00ad6142;
        }
      }
    }
LAB_00ad5d3a:
    bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)targetName.field_2._8_8_);
    if ((bVar1) || (dagCheckerParent == (cmGeneratorExpressionDAGChecker *)0x0)) {
LAB_00ad5fa9:
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        cmGeneratorExpressionNode::EvaluateDependentExpression
                  ((string *)((long)&linkedTargetsContent.field_2 + 8),(string *)local_640,
                   context->LG,context,(cmGeneratorTarget *)targetName.field_2._8_8_,
                   (cmGeneratorExpressionDAGChecker *)local_5d0,
                   (cmGeneratorTarget *)targetName.field_2._8_8_);
        cmGeneratorExpression::StripEmptyListElements
                  (&local_6c8,(string *)((long)&linkedTargetsContent.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_640,(string *)&local_6c8);
        std::__cxx11::string::~string((string *)&local_6c8);
        std::__cxx11::string::~string((string *)(linkedTargetsContent.field_2._M_local_buf + 8));
        getLinkedTargetsContent
                  ((string *)local_708,(cmGeneratorTarget *)targetName.field_2._8_8_,
                   (string *)local_4c8,context,(cmGeneratorExpressionDAGChecker *)local_5d0);
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) == 0) {
          cVar3 = std::__cxx11::string::empty();
          pcVar13 = ";";
          if (cVar3 != '\0') {
            pcVar13 = "";
          }
          std::operator+(&local_728,pcVar13,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_708);
          std::__cxx11::string::operator+=((string *)local_640,(string *)&local_728);
          std::__cxx11::string::~string((string *)&local_728);
        }
        std::__cxx11::string::~string((string *)local_708);
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_640);
    }
    else {
      bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                        (dagCheckerParent,(cmGeneratorTarget *)0x0,ANY);
      if (bVar1) goto LAB_00ad5fa9;
      bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                        ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,&context->Config
                        );
      if (bVar1) {
        context->HadContextSensitiveCondition = true;
        local_690 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
        local_978 = local_690;
        if (local_690 == (char *)0x0) {
          local_978 = "";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,local_978,
                   (allocator<char> *)((long)&propContent_4 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&propContent_4 + 7));
      }
      else {
        bVar1 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                          ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                           &context->Config);
        if (!bVar1) goto LAB_00ad5fa9;
        context->HadContextSensitiveCondition = true;
        local_6a0 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                              ((cmGeneratorTarget *)targetName.field_2._8_8_,(string *)&e,
                               &context->Config);
        local_9a0 = local_6a0;
        if (local_6a0 == (char *)0x0) {
          local_9a0 = "";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,local_9a0,&local_6a1);
        std::allocator<char>::~allocator(&local_6a1);
      }
    }
LAB_00ad6142:
    local_e0 = 1;
    std::__cxx11::string::~string((string *)local_640);
    break;
  case SELF_REFERENCE:
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              ((string *)((long)&result.field_2 + 8),content);
    cmGeneratorExpressionDAGChecker::ReportError
              ((cmGeneratorExpressionDAGChecker *)local_5d0,context,
               (string *)((long)&result.field_2 + 8));
    std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_e0 = 1;
    break;
  case CYCLIC_REFERENCE:
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_e0 = 1;
  }
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
            ((cmGeneratorExpressionDAGChecker *)local_5d0);
LAB_00ad617a:
  std::__cxx11::string::~string((string *)local_4c8);
LAB_00ad6196:
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)(propertyName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = nullptr;
    std::string targetName;
    std::string propertyName;

    if (parameters.size() == 2) {
      targetName = parameters[0];
      propertyName = parameters[1];

      if (const char* e = GetErrorText(targetName, propertyName)) {
        reportError(context, content->GetOriginalExpression(), e);
        return std::string();
      }
      if (propertyName == "ALIASED_TARGET"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return std::string();
      }
      if (propertyName == "ALIAS_GLOBAL"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          return context->LG->GetGlobalGenerator()->IsAlias(targetName)
            ? "TRUE"
            : "FALSE";
        }
        return std::string();
      }
      cmLocalGenerator const* lg = context->CurrentTarget
        ? context->CurrentTarget->GetLocalGenerator()
        : context->LG;
      target = lg->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);

    } else if (parameters.size() == 1) {
      target = context->HeadTarget;
      propertyName = parameters[0];

      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);

      context->HadHeadSensitiveCondition = true;
      if (!target) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
          "It may not be used with add_custom_command or add_custom_target. "
          " "
          " "
          "Specify the target to read a property from using the "
          "$<TARGET_PROPERTY:tgt,prop> signature instead.");
        return std::string();
      }
    } else {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }

    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME

    bool evaluatingLinkLibraries = false;

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression() ||
          dagCheckerParent->EvaluatingLinkerLauncher()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
        evaluatingLinkLibraries = true;
        if (!interfacePropertyName.empty()) {
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||
        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    if (isInterfaceProperty) {
      return cmGeneratorExpression::StripEmptyListElements(
        target->EvaluateInterfaceProperty(propertyName, context,
                                          dagCheckerParent));
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        // We handle transitive properties above.  For non-transitive
        // properties we accept repeats anyway.
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    std::string result;
    bool haveProp = false;
    if (cmValue p = target->GetProperty(propertyName)) {
      result = *p;
      haveProp = true;
    } else if (evaluatingLinkLibraries) {
      return std::string();
    }

    if (!haveProp && !target->IsImported() &&
        target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }

    if (!interfacePropertyName.empty()) {
      result = cmGeneratorExpression::StripEmptyListElements(
        this->EvaluateDependentExpression(result, context->LG, context, target,
                                          &dagChecker, target));
      std::string linkedTargetsContent = getLinkedTargetsContent(
        target, interfacePropertyName, context, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
    }
    return result;
  }